

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void am_delete_script_commands_proc(Am_Object *cmd)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  int local_a4;
  undefined1 local_a0 [4];
  int i;
  Am_Value_List new_original_command_list;
  Am_Value_List new_cmd_list;
  Am_Object found_sel;
  Am_Object this_cmd;
  Am_Value_List original_command_list;
  Am_Value_List orig_cmds;
  Am_Object execute_command;
  Am_Value_List sel_list;
  Am_Object scroll_menu;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object script_window;
  Am_Object *cmd_local;
  
  script_window.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  pAVar3 = Am_Object::Get(&local_18,Am_UNDO_SCROLL_GROUP,0);
  Am_Object::Am_Object((Am_Object *)&sel_list.item,pAVar3);
  pAVar3 = Am_Object::Get((Am_Object *)&sel_list.item,0x169,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&execute_command,pAVar3);
  pAVar3 = Am_Object::Get(&local_18,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object((Am_Object *)&orig_cmds.item,pAVar3);
  pAVar3 = Am_Object::Get((Am_Object *)&orig_cmds.item,Am_COMMANDS_PROTOTYPES,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&original_command_list.item,pAVar3);
  pAVar3 = Am_Object::Get((Am_Object *)&orig_cmds.item,Am_ORIGINAL_COMMAND_LIST,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&this_cmd,pAVar3);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&original_command_list.item)
  ;
  Am_Object::Set(cmd,0x16c,pAVar4,0);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&this_cmd);
  Am_Object::Set(cmd,AVar1,pAVar4,0);
  Am_Object::Am_Object(&found_sel);
  Am_Object::Am_Object((Am_Object *)&new_cmd_list.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&new_original_command_list.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_a0);
  local_a4 = 1;
  Am_Value_List::Start((Am_Value_List *)&original_command_list.item);
  while( true ) {
    bVar2 = Am_Value_List::Last((Am_Value_List *)&original_command_list.item);
    AVar1 = Am_COMMANDS_PROTOTYPES;
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pAVar3 = Am_Value_List::Get((Am_Value_List *)&original_command_list.item);
    Am_Object::operator=(&found_sel,pAVar3);
    bVar2 = am_find_cmd_in_sel((Am_Value_List *)&execute_command,&found_sel,
                               (Am_Object *)&new_cmd_list.item);
    if (!bVar2) {
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&found_sel);
      Am_Value_List::Add((Am_Value_List *)&new_original_command_list.item,pAVar4,Am_TAIL,true);
      pAVar3 = Am_Object::Get(&found_sel,0xc,0);
      Am_Value_List::Add((Am_Value_List *)local_a0,pAVar3,Am_TAIL,true);
      Am_Object::Set(&found_sel,Am_COMMAND_INDEX_IN_SCRIPT,local_a4,1);
      local_a4 = local_a4 + 1;
    }
    Am_Value_List::Next((Am_Value_List *)&original_command_list.item);
  }
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_
                     ((Am_Value_List *)&new_original_command_list.item);
  Am_Object::Set((Am_Object *)&orig_cmds.item,AVar1,pAVar4,0);
  AVar1 = Am_COMMANDS_IN_SCRIPT;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_
                     ((Am_Value_List *)&new_original_command_list.item);
  Am_Object::Set((Am_Object *)&orig_cmds.item,AVar1,pAVar4,0);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_a0);
  Am_Object::Set((Am_Object *)&orig_cmds.item,AVar1,pAVar4,0);
  am_set_commands_into_script_window(&local_18,(Am_Object *)&orig_cmds.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_a0);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&new_original_command_list.item);
  Am_Object::~Am_Object((Am_Object *)&new_cmd_list.item);
  Am_Object::~Am_Object(&found_sel);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&this_cmd);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&original_command_list.item);
  Am_Object::~Am_Object((Am_Object *)&orig_cmds.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&execute_command);
  Am_Object::~Am_Object((Am_Object *)&sel_list.item);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_delete_script_commands,
                 (Am_Object cmd))
{
  // *** SHOULD FIX UP REFERENCES TO THE DELETED COMMANDS
  // *** PLACEHOLDERS SET BY THESE COMMANDS
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object scroll_menu = script_window.Get(Am_UNDO_SCROLL_GROUP);
  Am_Value_List sel_list = scroll_menu.Get(Am_VALUE);
  Am_Object execute_command = script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Value_List orig_cmds = execute_command.Get(Am_COMMANDS_PROTOTYPES);
  Am_Value_List original_command_list =
      execute_command.Get(Am_ORIGINAL_COMMAND_LIST);

  cmd.Set(Am_OLD_VALUE, orig_cmds);
  cmd.Set(Am_ORIGINAL_COMMAND_LIST, original_command_list);

  Am_Object this_cmd, found_sel;
  Am_Value_List new_cmd_list, new_original_command_list;
  int i = 1;
  for (orig_cmds.Start(); !orig_cmds.Last(); orig_cmds.Next()) {
    this_cmd = orig_cmds.Get();
    if (!am_find_cmd_in_sel(sel_list, this_cmd, found_sel)) {
      new_cmd_list.Add(this_cmd);
      new_original_command_list.Add(this_cmd.Get(Am_SOURCE_OF_COPY));
      this_cmd.Set(Am_COMMAND_INDEX_IN_SCRIPT, i++, Am_OK_IF_NOT_THERE);
    }
  }
  execute_command.Set(Am_COMMANDS_PROTOTYPES, new_cmd_list);
  execute_command.Set(Am_COMMANDS_IN_SCRIPT, new_cmd_list);
  execute_command.Set(Am_ORIGINAL_COMMAND_LIST, new_original_command_list);

  am_set_commands_into_script_window(script_window, execute_command);
}